

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_pow.c
# Opt level: O0

void zzPowerMod(word *c,word *a,size_t n,word *b,size_t m,word *mod,void *stack)

{
  size_t sVar1;
  size_t in_RDX;
  void *in_RDI;
  word *in_R9;
  qr_o *unaff_retaddr;
  qr_o *in_stack_00000008;
  qr_o *r;
  word *t;
  size_t no;
  void *in_stack_ffffffffffffffa8;
  size_t *dest;
  size_t *mod_00;
  
  wwOctetSize(in_R9,in_RDX);
  dest = &(in_stack_00000008->hdr).keep + in_RDX;
  mod_00 = dest;
  sVar1 = zmCreate_keep((size_t)in_stack_00000008);
  sVar1 = (long)dest + sVar1;
  u64To(dest,(size_t)in_stack_ffffffffffffffa8,(u64 *)0x170b93);
  zmCreate(in_stack_00000008,(octet *)mod_00,(size_t)dest,in_stack_ffffffffffffffa8);
  u64To(dest,(size_t)in_stack_ffffffffffffffa8,(u64 *)0x170bc0);
  (*(code *)mod_00[8])(in_stack_00000008,in_stack_00000008,mod_00,sVar1);
  qrPower((word *)no,t,(word *)r,sVar1,unaff_retaddr,in_RDI);
  (*(code *)mod_00[9])(in_stack_00000008,in_stack_00000008,mod_00,sVar1);
  u64From(dest,in_stack_ffffffffffffffa8,0x170c35);
  return;
}

Assistant:

void zzPowerMod(word c[], const word a[], size_t n, const word b[], size_t m,
	const word mod[], void* stack)
{
	size_t no;
	// переменные в stack
	word* t;
	qr_o* r;
	// pre
	ASSERT(n > 0 && mod[n - 1] != 0);
	ASSERT(wwCmp(a, mod, n) < 0);
	// размерности
	no = wwOctetSize(mod, n);
	// раскладка stack
	t = (word*)stack;
	r = (qr_o*)(t + n);
	stack = (octet*)r + zmCreate_keep(no);
	// r <- Zm(mod)
	wwTo(t, no, mod);
	zmCreate(r, (octet*)t, no, stack);
	// t <- a
	wwTo(t, no, a);
	qrFrom(t, (octet*)t, r, stack);
	// t <- a^b
	qrPower(t, t, b, m, r, stack);
	// c <- t
	qrTo((octet*)t, t, r, stack);
	wwFrom(c, t, no);
}